

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void backward::SignalHandling::sig_handler(int signo,siginfo_t *info,void *_ctx)

{
  int *in_RSI;
  void *in_stack_00000100;
  siginfo_t *in_stack_00000108;
  int in_stack_00000114;
  
  handleSignal(in_stack_00000114,in_stack_00000108,in_stack_00000100);
  raise(*in_RSI);
  puts("watf? exit");
  _exit(1);
}

Assistant:

static void
  sig_handler(int signo, siginfo_t *info, void *_ctx) {
    handleSignal(signo, info, _ctx);

    // try to forward the signal.
    raise(info->si_signo);

    // terminate the process immediately.
    puts("watf? exit");
    _exit(EXIT_FAILURE);
  }